

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O0

void __thiscall cmCommandArgumentParserHelper::CleanupParser(cmCommandArgumentParserHelper *this)

{
  bool bVar1;
  reference ppcVar2;
  __normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_> local_48;
  const_iterator local_40;
  __normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_> local_38;
  const_iterator local_30;
  __normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_> local_28;
  char **local_20;
  __normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_> local_18;
  iterator sit;
  cmCommandArgumentParserHelper *this_local;
  
  sit._M_current = (char **)this;
  __gnu_cxx::__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>::
  __normal_iterator(&local_18);
  local_20 = (char **)std::vector<char_*,_std::allocator<char_*>_>::begin(&this->Variables);
  local_18._M_current = local_20;
  while( true ) {
    local_28._M_current =
         (char **)std::vector<char_*,_std::allocator<char_*>_>::end(&this->Variables);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_28);
    if (!bVar1) break;
    ppcVar2 = __gnu_cxx::__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>::
              operator*(&local_18);
    if (*ppcVar2 != (char *)0x0) {
      operator_delete__(*ppcVar2);
    }
    __gnu_cxx::__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>::operator++
              (&local_18);
  }
  local_38._M_current =
       (char **)std::vector<char_*,_std::allocator<char_*>_>::begin(&this->Variables);
  __gnu_cxx::__normal_iterator<char*const*,std::vector<char*,std::allocator<char*>>>::
  __normal_iterator<char**>
            ((__normal_iterator<char*const*,std::vector<char*,std::allocator<char*>>> *)&local_30,
             &local_38);
  local_48._M_current = (char **)std::vector<char_*,_std::allocator<char_*>_>::end(&this->Variables)
  ;
  __gnu_cxx::__normal_iterator<char*const*,std::vector<char*,std::allocator<char*>>>::
  __normal_iterator<char**>
            ((__normal_iterator<char*const*,std::vector<char*,std::allocator<char*>>> *)&local_40,
             &local_48);
  std::vector<char_*,_std::allocator<char_*>_>::erase(&this->Variables,local_30,local_40);
  return;
}

Assistant:

void cmCommandArgumentParserHelper::CleanupParser()
{
  std::vector<char*>::iterator sit;
  for ( sit = this->Variables.begin();
    sit != this->Variables.end();
    ++ sit )
    {
    delete [] *sit;
    }
  this->Variables.erase(this->Variables.begin(), this->Variables.end());
}